

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

uint32 __thiscall Js::RecyclableArrayWalker::GetChildrenCount(RecyclableArrayWalker *this)

{
  bool bVar1;
  uint32 uVar2;
  JavascriptArray *arrayObj_00;
  uint32 local_34;
  JavascriptArray *arrayObj;
  uint32 count;
  RecyclableArrayWalker *this_local;
  
  bVar1 = Js::JavascriptArray::IsNonES5Array((this->super_RecyclableObjectWalker).instance);
  if ((!bVar1) &&
     (bVar1 = VarIs<Js::ES5Array>((this->super_RecyclableObjectWalker).instance), !bVar1)) {
    return 0;
  }
  if ((this->fOnlyOwnProperties & 1U) == 0) {
    local_34 = RecyclableObjectWalker::GetChildrenCount(&this->super_RecyclableObjectWalker);
  }
  else {
    local_34 = 0;
  }
  arrayObj_00 = GetArrayObject(this);
  uVar2 = GetItemCount(this,arrayObj_00);
  return uVar2 + local_34;
}

Assistant:

uint32 RecyclableArrayWalker::GetChildrenCount()
    {
        if (Js::JavascriptArray::IsNonES5Array(instance) || Js::VarIs<Js::ES5Array>(instance))
        {
            uint32 count = (!fOnlyOwnProperties ? RecyclableObjectWalker::GetChildrenCount() : 0);

            Js::JavascriptArray* arrayObj = GetArrayObject();

            return GetItemCount(arrayObj) + count;
        }

        return 0;
    }